

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxapp.h
# Opt level: O1

void __thiscall
ktxApp::processCommandLine
          (ktxApp *this,int argc,char **argv,StdinUse stdinStat,OutfilePos outfilePos)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  commandOptions *this_00;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  value_type *__x;
  char cVar8;
  uint uVar9;
  long lVar10;
  pointer pbVar11;
  argparser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  argparser local_70;
  
  pcVar2 = *argv;
  psVar1 = &this->name;
  pcVar3 = (char *)(this->name)._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)pcVar2);
  cVar8 = (char)psVar1;
  lVar6 = std::__cxx11::string::rfind(cVar8,0x5c);
  if (lVar6 == -1) {
    lVar6 = std::__cxx11::string::rfind(cVar8,0x2f);
  }
  if (lVar6 != -1) {
    std::__cxx11::string::erase((ulong)psVar1,0);
  }
  uVar7 = std::__cxx11::string::rfind(cVar8,0x2e);
  if (uVar7 != 0xffffffffffffffff) {
    if ((this->name)._M_string_length < uVar7) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar7);
      goto LAB_001131f2;
    }
    (this->name)._M_string_length = uVar7;
    (this->name)._M_dataplus._M_p[uVar7] = '\0';
  }
  argparser::argparser(&local_70,argc,argv);
  (*this->_vptr_ktxApp[2])(this,&local_70);
  if (local_70.optind != argc) {
    if (outfilePos == eFirst) {
      std::__cxx11::string::_M_assign((string *)&this->options->outfile);
      local_70.optind = local_70.optind + 1;
    }
    uVar9 = argc - (uint)(outfilePos == eLast);
    if (local_70.optind < uVar9) {
      lVar6 = (ulong)local_70.optind << 5;
      lVar10 = 0;
      do {
        pcVar2 = *(char **)((long)&((local_70.argv.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar6);
        __x = (value_type *)
              ((long)&((local_70.argv.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6);
        if (*pcVar2 == '@') {
          bVar4 = loadFileList(this,__x,pcVar2[1] == '@',&this->options->infiles);
          if (!bVar4) goto LAB_001131d0;
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->options->infiles,__x);
        }
        lVar6 = lVar6 + 0x20;
        lVar10 = lVar10 + -1;
      } while ((ulong)local_70.optind - (ulong)uVar9 != lVar10);
    }
    pbVar11 = (this->options->infiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((0x20 < (ulong)((long)(this->options->infiles).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) &&
       (pbVar11 < (this->options->infiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
      do {
        iVar5 = std::__cxx11::string::compare((char *)pbVar11);
        if (iVar5 == 0) {
          error(this,"cannot use stdin as one among many inputs.");
          (*this->_vptr_ktxApp[1])(this);
          goto LAB_001131d0;
        }
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 < (this->options->infiles).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (outfilePos == eLast) {
      std::__cxx11::string::_M_assign((string *)&this->options->outfile);
    }
  }
  this_00 = this->options;
  if ((this_00->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this_00->infiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if (stdinStat != eAllowStdin) {
LAB_001131f2:
      error(this,"need some input files.");
      (*this->_vptr_ktxApp[1])(this);
LAB_001131d0:
      exit(1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if ((outfilePos != eNone) && ((this->options->outfile)._M_string_length == 0)) {
    error(this,"need an output file");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70.argv.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.optarg._M_dataplus._M_p != &local_70.optarg.field_2) {
    operator_delete(local_70.optarg._M_dataplus._M_p,
                    local_70.optarg.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void processCommandLine(int argc, char* argv[],
                            StdinUse stdinStat = eAllowStdin,
                            OutfilePos outfilePos = eNone)
    {
        uint32_t i;
        size_t slash, dot;

        name = argv[0];
        // For consistent Id, only use the stem of name;
        slash = name.find_last_of('\\');
        if (slash == string::npos)
            slash = name.find_last_of('/');
        if (slash != string::npos)
            name.erase(0, slash+1);  // Remove directory name.
        dot = name.find_last_of('.');
            if (dot != string::npos)
                name.erase(dot, string::npos); // Remove extension.

        argparser parser(argc, argv);
        processOptions(parser);

        i = parser.optind;
        if (argc - i > 0) {
            if (outfilePos == eFirst)
                options.outfile = parser.argv[i++];
            uint32_t infileCount = outfilePos == eLast ? argc - 1 : argc;
            for (; i < infileCount; i++) {
                if (parser.argv[i][0] == '@') {
                    if (!loadFileList(parser.argv[i],
                                      parser.argv[i][1] == '@',
                                      options.infiles)) {
                        exit(1);
                    }
                } else {
                    options.infiles.push_back(parser.argv[i]);
                }
            }
            if (options.infiles.size() > 1) {
                std::vector<string>::const_iterator it;
                for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
                    if (it->compare("-") == 0) {
                        error("cannot use stdin as one among many inputs.");
                        usage();
                        exit(1);
                    }
                }
            }
            if (outfilePos == eLast)
                options.outfile = parser.argv[i];
        }

        if (options.infiles.size() == 0) {
            if (stdinStat == eAllowStdin) {
                options.infiles.push_back("-"); // Use stdin as 0 files.
            } else {
                error("need some input files.");
                usage();
                exit(1);
            }
        }
        if (outfilePos != eNone && options.outfile.empty()) {
            error("need an output file");
        }
    }